

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_10.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementTetraCorot_10::ComputeInternalForces(ChElementTetraCorot_10 *this)

{
  ChVectorDynamic<> *in_RSI;
  
  ComputeInternalForces((ChElementTetraCorot_10 *)&this[-1].field_0x1b8,in_RSI);
  return;
}

Assistant:

void ChElementTetraCorot_10::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    assert(Fi.size() == GetNdofs());

    // set up vector of nodal displacements (in local element system) u_l = R*p - p0
    ChVectorDynamic<> displ(GetNdofs());
    this->GetStateBlock(displ);

    // [local Internal Forces] = [Klocal] * displ + [Rlocal] * displ_dt
    ChVectorDynamic<> FiK_local = StiffnessMatrix * displ;

    // nodal speeds, local
    displ.segment(0, 3) = A.transpose() * nodes[0]->pos_dt.eigen();
    displ.segment(3, 3) = A.transpose() * nodes[1]->pos_dt.eigen();
    displ.segment(6, 3) = A.transpose() * nodes[2]->pos_dt.eigen();
    displ.segment(9, 3) = A.transpose() * nodes[3]->pos_dt.eigen();
    displ.segment(12, 3) = A.transpose() * nodes[4]->pos_dt.eigen();
    displ.segment(15, 3) = A.transpose() * nodes[5]->pos_dt.eigen();
    displ.segment(18, 3) = A.transpose() * nodes[6]->pos_dt.eigen();
    displ.segment(21, 3) = A.transpose() * nodes[7]->pos_dt.eigen();
    displ.segment(24, 3) = A.transpose() * nodes[8]->pos_dt.eigen();
    displ.segment(27, 3) = A.transpose() * nodes[9]->pos_dt.eigen();

    double lumped_node_mass = (GetVolume() * Material->Get_density()) / GetNnodes();
    ChVectorDynamic<> FiR_local =
        Material->Get_RayleighDampingK() * (StiffnessMatrix * displ + lumped_node_mass * displ);
    //***TO DO*** better per-node lumping, or 12x12 consistent mass matrix.

    FiK_local += FiR_local;
    FiK_local *= -1.0;

    // Fi = C * Fi_local  with C block-diagonal rotations A
    ChMatrixCorotation::ComputeCK(FiK_local, this->A, 10, Fi);
}